

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::ClearCompactChar(CharSet<char16_t> *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  uVar3 = GetCompactLength(this);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x210,"(index < this->GetCompactLength())",
                       "index < this->GetCompactLength()");
    if (!bVar2) goto LAB_00cdc1b9;
    *puVar4 = 0;
  }
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x211,"(IsCompact())","IsCompact()");
    if (!bVar2) {
LAB_00cdc1b9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  *(undefined4 *)((long)&this->rep + (ulong)index * 4 + 8) = 0xffffffff;
  return;
}

Assistant:

inline void ClearCompactChar(uint index)
        {
            Assert(index < this->GetCompactLength());
            Assert(IsCompact());
            rep.compact.cs[index] = emptySlot;
        }